

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTPNInlineObjectBase::adjust_for_dyn(CTPNInlineObjectBase *this,tcpn_dyncomp_info *info)

{
  undefined8 in_RSI;
  CTcPrsNode *in_RDI;
  CTPNObjProp *prop;
  CTPNObjPropBase *local_18;
  
  for (local_18 = (CTPNObjPropBase *)in_RDI[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
      local_18 != (CTPNObjPropBase *)0x0;
      local_18 = &CTPNObjPropBase::get_next_prop(local_18)->super_CTPNObjPropBase) {
    (*(local_18->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
      _vptr_CTcPrsNodeBase[0x11])(local_18,in_RSI);
  }
  return in_RDI;
}

Assistant:

CTcPrsNode *CTPNInlineObjectBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    /* adjust each property expression */
    for (CTPNObjProp *prop = proplist_.first_ ; prop != 0 ;
         prop = prop->get_next_prop())
        prop->adjust_for_dyn(info);

    /* we did our updates in-place */
    return this;
}